

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O0

jtokentype getJsonToken(string *tokenVal,uint *consumed,char *raw,char *end)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *in_RCX;
  byte *in_RDX;
  int *in_RSI;
  long in_FS_OFFSET;
  char *firstDigit;
  char *first;
  char *rawStart;
  uint codepoint;
  JSONUTF8StringFilter writer;
  string valStr;
  string numStr;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  char __c;
  uchar ch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *first_00;
  bool local_ca;
  bool local_c7;
  bool local_c4;
  bool local_b1;
  byte *local_a0;
  byte *local_80;
  jtokentype local_68;
  char local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  *in_RSI = 0;
  local_80 = in_RDX;
  while( true ) {
    local_b1 = false;
    if (local_80 < in_RCX) {
      local_b1 = json_isspace(in_stack_ffffffffffffff08);
    }
    if (local_b1 == false) break;
    local_80 = local_80 + 1;
  }
  if (in_RCX <= local_80) {
    local_68 = JTOK_NONE;
    goto LAB_00955d68;
  }
  iVar2 = (int)in_RDX;
  iVar3 = (int)local_80;
  switch(*local_80) {
  case 0x22:
    first_00 = local_48;
    std::__cxx11::string::string(in_stack_ffffffffffffff20);
    JSONUTF8StringFilter::JSONUTF8StringFilter
              ((JSONUTF8StringFilter *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
               ,(string *)0x955a43);
    pbVar6 = local_80;
    while ((local_80 = pbVar6 + 1, local_80 < in_RCX && (0x1f < *local_80))) {
      ch = (uchar)(in_stack_ffffffffffffff14 >> 0x18);
      if (*local_80 == 0x5c) {
        pbVar7 = pbVar6 + 2;
        if (in_RCX <= pbVar7) {
          local_68 = JTOK_ERR;
          goto LAB_00955d4e;
        }
        switch((char *)(ulong)((int)(char)*pbVar7 - 0x22)) {
        case (char *)0x0:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        default:
          local_68 = JTOK_ERR;
          goto LAB_00955d4e;
        case (char *)0xd:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x3a:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x40:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x44:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x4c:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x50:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x52:
          JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
          pbVar6 = pbVar7;
          break;
        case (char *)0x53:
          if ((in_RCX <= pbVar6 + 7) ||
             (in_stack_ffffffffffffff18 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   hatoui(first_00,(char *)(ulong)((int)(char)*pbVar7 - 0x22),
                          (uint *)in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff18 !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pbVar6 + 7))) {
            local_68 = JTOK_ERR;
            goto LAB_00955d4e;
          }
          JSONUTF8StringFilter::push_back_u
                    ((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
          pbVar6 = pbVar6 + 6;
        }
      }
      else {
        if (*local_80 == 0x22) {
          bVar4 = JSONUTF8StringFilter::finalize((JSONUTF8StringFilter *)in_stack_ffffffffffffff18);
          if (bVar4) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_ffffffffffffff18,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(CONCAT13(bVar4,(int3)in_stack_ffffffffffffff14),
                               in_stack_ffffffffffffff10));
            *in_RSI = ((int)pbVar6 + 2) - iVar2;
            local_68 = JTOK_STRING;
          }
          else {
            local_68 = JTOK_ERR;
          }
          goto LAB_00955d4e;
        }
        JSONUTF8StringFilter::push_back((JSONUTF8StringFilter *)in_stack_ffffffffffffff18,ch);
        pbVar6 = local_80;
      }
    }
    local_68 = JTOK_ERR;
LAB_00955d4e:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    break;
  default:
    local_68 = JTOK_ERR;
    break;
  case 0x2c:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_COMMA;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    std::__cxx11::string::string(in_stack_ffffffffffffff20);
    local_a0 = local_80;
    bVar4 = json_isdigit(in_stack_ffffffffffffff0c);
    if (!bVar4) {
      local_a0 = local_80 + 1;
    }
    if ((*local_a0 == 0x30) && (bVar4 = json_isdigit(in_stack_ffffffffffffff0c), bVar4)) {
      local_68 = JTOK_ERR;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff18,(char)(in_stack_ffffffffffffff14 >> 0x18));
      pbVar6 = local_80 + 1;
      bVar1 = *local_80;
      local_80 = pbVar6;
      if ((bVar1 != 0x2d) ||
         ((in_RCX <= pbVar6 || (bVar4 = json_isdigit(in_stack_ffffffffffffff0c), bVar4)))) {
        while( true ) {
          local_c4 = false;
          if (local_80 < in_RCX) {
            local_c4 = json_isdigit(in_stack_ffffffffffffff0c);
          }
          __c = (char)(in_stack_ffffffffffffff14 >> 0x18);
          if (local_c4 == false) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_ffffffffffffff18,__c);
          local_80 = local_80 + 1;
        }
        if ((local_80 < in_RCX) && (*local_80 == 0x2e)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_ffffffffffffff18,__c);
          local_80 = local_80 + 1;
          if ((in_RCX <= local_80) || (bVar4 = json_isdigit(in_stack_ffffffffffffff0c), !bVar4)) {
            local_68 = JTOK_ERR;
            goto LAB_00955a00;
          }
          while( true ) {
            local_c7 = false;
            if (local_80 < in_RCX) {
              local_c7 = json_isdigit(in_stack_ffffffffffffff0c);
            }
            if (local_c7 == false) break;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(in_stack_ffffffffffffff18,(char)(in_stack_ffffffffffffff14 >> 0x18));
            local_80 = local_80 + 1;
          }
        }
        if ((local_80 < in_RCX) && ((*local_80 == 0x65 || (*local_80 == 0x45)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_ffffffffffffff18,(char)(in_stack_ffffffffffffff14 >> 0x18));
          pbVar6 = local_80 + 1;
          if ((pbVar6 < in_RCX) && ((*pbVar6 == 0x2d || (*pbVar6 == 0x2b)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(in_stack_ffffffffffffff18,(char)(in_stack_ffffffffffffff14 >> 0x18));
            pbVar6 = local_80 + 2;
          }
          local_80 = pbVar6;
          if ((in_RCX <= local_80) || (bVar4 = json_isdigit(in_stack_ffffffffffffff0c), !bVar4)) {
            local_68 = JTOK_ERR;
            goto LAB_00955a00;
          }
          while( true ) {
            local_ca = false;
            if (local_80 < in_RCX) {
              local_ca = json_isdigit(in_stack_ffffffffffffff0c);
            }
            if (local_ca == false) break;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(in_stack_ffffffffffffff18,(char)(in_stack_ffffffffffffff14 >> 0x18));
            local_80 = local_80 + 1;
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffff18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        *in_RSI = (int)local_80 - iVar2;
        local_68 = JTOK_NUMBER;
      }
      else {
        local_68 = JTOK_ERR;
      }
    }
LAB_00955a00:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    break;
  case 0x3a:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_COLON;
    break;
  case 0x5b:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_ARR_OPEN;
    break;
  case 0x5d:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_ARR_CLOSE;
    break;
  case 0x66:
  case 0x6e:
  case 0x74:
    iVar5 = strncmp((char *)local_80,"null",4);
    if (iVar5 == 0) {
      *in_RSI = (iVar3 + 4) - iVar2;
      local_68 = JTOK_KW_NULL;
    }
    else {
      iVar5 = strncmp((char *)local_80,"true",4);
      if (iVar5 == 0) {
        *in_RSI = (iVar3 + 4) - iVar2;
        local_68 = JTOK_KW_TRUE;
      }
      else {
        iVar5 = strncmp((char *)local_80,"false",5);
        if (iVar5 == 0) {
          *in_RSI = (iVar3 + 5) - iVar2;
          local_68 = JTOK_KW_FALSE;
        }
        else {
          local_68 = JTOK_ERR;
        }
      }
    }
    break;
  case 0x7b:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_OBJ_OPEN;
    break;
  case 0x7d:
    *in_RSI = (iVar3 + 1) - iVar2;
    local_68 = JTOK_OBJ_CLOSE;
  }
LAB_00955d68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

enum jtokentype getJsonToken(std::string& tokenVal, unsigned int& consumed,
                            const char *raw, const char *end)
{
    tokenVal.clear();
    consumed = 0;

    const char *rawStart = raw;

    while (raw < end && (json_isspace(*raw)))          // skip whitespace
        raw++;

    if (raw >= end)
        return JTOK_NONE;

    switch (*raw) {

    case '{':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_OPEN;
    case '}':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_CLOSE;
    case '[':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_OPEN;
    case ']':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_CLOSE;

    case ':':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COLON;
    case ',':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COMMA;

    case 'n':
    case 't':
    case 'f':
        if (!strncmp(raw, "null", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_NULL;
        } else if (!strncmp(raw, "true", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_TRUE;
        } else if (!strncmp(raw, "false", 5)) {
            raw += 5;
            consumed = (raw - rawStart);
            return JTOK_KW_FALSE;
        } else
            return JTOK_ERR;

    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
        // part 1: int
        std::string numStr;

        const char *first = raw;

        const char *firstDigit = first;
        if (!json_isdigit(*firstDigit))
            firstDigit++;
        if ((*firstDigit == '0') && json_isdigit(firstDigit[1]))
            return JTOK_ERR;

        numStr += *raw;                       // copy first char
        raw++;

        if ((*first == '-') && (raw < end) && (!json_isdigit(*raw)))
            return JTOK_ERR;

        while (raw < end && json_isdigit(*raw)) {  // copy digits
            numStr += *raw;
            raw++;
        }

        // part 2: frac
        if (raw < end && *raw == '.') {
            numStr += *raw;                   // copy .
            raw++;

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        // part 3: exp
        if (raw < end && (*raw == 'e' || *raw == 'E')) {
            numStr += *raw;                   // copy E
            raw++;

            if (raw < end && (*raw == '-' || *raw == '+')) { // copy +/-
                numStr += *raw;
                raw++;
            }

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        tokenVal = numStr;
        consumed = (raw - rawStart);
        return JTOK_NUMBER;
        }

    case '"': {
        raw++;                                // skip "

        std::string valStr;
        JSONUTF8StringFilter writer(valStr);

        while (true) {
            if (raw >= end || (unsigned char)*raw < 0x20)
                return JTOK_ERR;

            else if (*raw == '\\') {
                raw++;                        // skip backslash

                if (raw >= end)
                    return JTOK_ERR;

                switch (*raw) {
                case '"':  writer.push_back('\"'); break;
                case '\\': writer.push_back('\\'); break;
                case '/':  writer.push_back('/'); break;
                case 'b':  writer.push_back('\b'); break;
                case 'f':  writer.push_back('\f'); break;
                case 'n':  writer.push_back('\n'); break;
                case 'r':  writer.push_back('\r'); break;
                case 't':  writer.push_back('\t'); break;

                case 'u': {
                    unsigned int codepoint;
                    if (raw + 1 + 4 >= end ||
                        hatoui(raw + 1, raw + 1 + 4, codepoint) !=
                               raw + 1 + 4)
                        return JTOK_ERR;
                    writer.push_back_u(codepoint);
                    raw += 4;
                    break;
                    }
                default:
                    return JTOK_ERR;

                }

                raw++;                        // skip esc'd char
            }

            else if (*raw == '"') {
                raw++;                        // skip "
                break;                        // stop scanning
            }

            else {
                writer.push_back(static_cast<unsigned char>(*raw));
                raw++;
            }
        }

        if (!writer.finalize())
            return JTOK_ERR;
        tokenVal = valStr;
        consumed = (raw - rawStart);
        return JTOK_STRING;
        }

    default:
        return JTOK_ERR;
    }
}